

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_setupresult(ASMState *as,IRIns *ir,CCallInfo *ci)

{
  byte bVar1;
  MCode *pMVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  Reg RVar8;
  RegSet drop;
  IRIns *ir_00;
  Reg RVar9;
  Reg RVar10;
  bool bVar11;
  ulong uVar12;
  
  if (*(char *)((long)ir + 0xd) == '\x10') {
    bVar11 = (*(byte *)((long)ir + 0xc) & 0x1f) != 0;
  }
  else {
    bVar11 = false;
  }
  bVar3 = (ir->field_1).r & 0x1f;
  uVar7 = 0xffff0fc7;
  if (-1 < (char)(ir->field_1).r) {
    uVar7 = -2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3;
  }
  drop = uVar7 & (uint)((*(byte *)((long)&ci->flags + 1) & 4) >> 2) * 0x10000 - 0xf039;
  if ((bVar11) && (-1 < *(char *)((long)ir + 0xe))) {
    drop = drop & ~(1 << ((int)*(char *)((long)ir + 0xe) & 0x1fU));
  }
  ra_evictset(as,drop);
  bVar3 = (ir->field_1).r;
  RVar8 = (Reg)bVar3;
  if (((char)bVar3 < '\0') && ((ir->field_1).s == '\0')) {
    return;
  }
  bVar4 = (ir->field_1).t.irt & 0x1f;
  if ((byte)(bVar4 - 0xd) < 2) {
    if ((ci->flags & 0x200) != 0) {
      bVar4 = (ir->field_1).s;
      if (-1 < (char)bVar3) {
        iVar6 = 1 << (bVar3 & 0x1f);
        uVar12._0_4_ = as->freeset;
        uVar12._4_4_ = as->modset;
        uVar12 = CONCAT44(iVar6,iVar6) | uVar12;
        as->freeset = (int)uVar12;
        as->modset = (int)(uVar12 >> 0x20);
        emit_rr(as,XO_MOVD,RVar8 | 0x80200,0);
      }
      if (bVar4 == 0) {
        return;
      }
      emit_rmro(as,XO_MOVto,0x80200,4,(uint)bVar4 << 2);
      return;
    }
    RVar8 = 0x10;
LAB_0013b676:
    ra_destreg(as,ir,RVar8);
    return;
  }
  if (!bVar11) {
    RVar8 = 0;
    goto LAB_0013b676;
  }
  bVar1 = *(byte *)((long)ir + 0xe);
  RVar10 = (Reg)bVar1;
  RVar9 = (Reg)bVar1;
  ir_00 = ir;
  if ((0x605fd9U >> bVar4 & 1) == 0) {
    ir_00 = ir + 1;
  }
  uVar7 = as->freeset;
  if ((bVar1 != 0 && bVar3 != 0) && (uVar7 & 1) == 0) {
    ra_restore(as,(uint)(ushort)as->cost[0]);
    uVar7 = as->freeset;
  }
  if ((bVar3 != 2 && (uVar7 & 4) == 0) && bVar1 != 2) {
    ra_restore(as,(uint)(ushort)as->cost[2]);
  }
  if ((char)bVar3 < '\0') {
    if ((char)bVar1 < '\0') goto LAB_0013b752;
    uVar7 = as->freeset;
    uVar5 = as->modset;
    RVar8 = 0;
LAB_0013b6a0:
    as->freeset = uVar7 | 1 << (bVar1 & 0x1f);
    as->modset = uVar5 | 1 << (bVar1 & 0x1f);
    if (RVar8 == 2) {
      if (bVar1 == 0) {
        pMVar2 = as->mcp;
        as->mcp = pMVar2 + -1;
        pMVar2[-1] = 0x92;
        uVar7._0_2_ = *(IROpT *)((long)ir_00 + 4);
        uVar7._2_2_ = *(IRRef1 *)((long)ir_00 + 6);
        if ((0x605fd9U >> (uVar7 & 0x1f) & 1) != 0) {
          pMVar2 = as->mcp;
          as->mcp = pMVar2 + -1;
          pMVar2[-1] = 'H';
        }
        goto LAB_0013b752;
      }
      goto LAB_0013b6be;
    }
    if (RVar9 != 2) {
      if (RVar9 == 0) {
        RVar10 = 0;
      }
      emit_movrr(as,ir_00,RVar10,2);
    }
LAB_0013b73f:
    if (RVar8 == 0) goto LAB_0013b752;
    RVar10 = 0;
  }
  else {
    uVar7 = as->freeset | 1 << (RVar8 & 0x1f);
    as->freeset = uVar7;
    uVar5 = as->modset | 1 << (RVar8 & 0x1f);
    as->modset = uVar5;
    if (-1 < (char)bVar1) goto LAB_0013b6a0;
    if (RVar8 != 2) goto LAB_0013b73f;
    RVar9 = 2;
LAB_0013b6be:
    emit_movrr(as,ir_00,2,0);
    if (RVar9 == 2) goto LAB_0013b752;
    RVar10 = 2;
    RVar8 = RVar9;
  }
  emit_movrr(as,ir_00,RVar8,RVar10);
LAB_0013b752:
  if (*(char *)((long)ir + 0xf) != '\0') {
    ra_save(as,ir + 1,2);
  }
  if ((ir->field_1).s == '\0') {
    return;
  }
  ra_save(as,ir,0);
  return;
}

Assistant:

static void asm_setupresult(ASMState *as, IRIns *ir, const CCallInfo *ci)
{
  RegSet drop = RSET_SCRATCH;
  int hiop = ((ir+1)->o == IR_HIOP && !irt_isnil((ir+1)->t));
  if ((ci->flags & CCI_NOFPRCLOBBER))
    drop &= ~RSET_FPR;
  if (ra_hasreg(ir->r))
    rset_clear(drop, ir->r);  /* Dest reg handled below. */
  if (hiop && ra_hasreg((ir+1)->r))
    rset_clear(drop, (ir+1)->r);  /* Dest reg handled below. */
  ra_evictset(as, drop);  /* Evictions must be performed first. */
  if (ra_used(ir)) {
    if (irt_isfp(ir->t)) {
      int32_t ofs = sps_scale(ir->s);  /* Use spill slot or temp slots. */
#if LJ_64
      if ((ci->flags & CCI_CASTU64)) {
	Reg dest = ir->r;
	if (ra_hasreg(dest)) {
	  ra_free(as, dest);
	  ra_modified(as, dest);
	  emit_rr(as, XO_MOVD, dest|REX_64, RID_RET);  /* Really MOVQ. */
	}
	if (ofs) emit_movtomro(as, RID_RET|REX_64, RID_ESP, ofs);
      } else {
	ra_destreg(as, ir, RID_FPRET);
      }
#else
      /* Number result is in x87 st0 for x86 calling convention. */
      Reg dest = ir->r;
      if (ra_hasreg(dest)) {
	ra_free(as, dest);
	ra_modified(as, dest);
	emit_rmro(as, irt_isnum(ir->t) ? XO_MOVSD : XO_MOVSS,
		  dest, RID_ESP, ofs);
      }
      if ((ci->flags & CCI_CASTU64)) {
	emit_movtomro(as, RID_RETLO, RID_ESP, ofs);
	emit_movtomro(as, RID_RETHI, RID_ESP, ofs+4);
      } else {
	emit_rmro(as, irt_isnum(ir->t) ? XO_FSTPq : XO_FSTPd,
		  irt_isnum(ir->t) ? XOg_FSTPq : XOg_FSTPd, RID_ESP, ofs);
      }
#endif
    } else if (hiop) {
      ra_destpair(as, ir);
    } else {
      lj_assertA(!irt_ispri(ir->t), "PRI dest");
      ra_destreg(as, ir, RID_RET);
    }
  } else if (LJ_32 && irt_isfp(ir->t) && !(ci->flags & CCI_CASTU64)) {
    emit_x87op(as, XI_FPOP);  /* Pop unused result from x87 st0. */
  }
}